

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O1

void __thiscall cmFindCommon::SelectDefaultRootPathMode(cmFindCommon *this)

{
  pointer pcVar1;
  int iVar2;
  RootPathMode RVar3;
  string *psVar4;
  string rootPathMode;
  string findRootPathVar;
  long *local_58 [2];
  long local_48 [2];
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"CMAKE_FIND_ROOT_PATH_MODE_","");
  std::__cxx11::string::_M_append((char *)&local_38,(ulong)(this->CMakePathName)._M_dataplus._M_p);
  psVar4 = cmMakefile::GetSafeDefinition((this->super_cmCommand).Makefile,&local_38);
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar1,pcVar1 + psVar4->_M_string_length);
  iVar2 = std::__cxx11::string::compare((char *)local_58);
  if (iVar2 == 0) {
    RVar3 = RootPathModeNever;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)local_58);
    if (iVar2 == 0) {
      RVar3 = RootPathModeOnly;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)local_58);
      if (iVar2 != 0) goto LAB_0034b39c;
      RVar3 = RootPathModeBoth;
    }
  }
  this->FindRootPathMode = RVar3;
LAB_0034b39c:
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmFindCommon::SelectDefaultRootPathMode()
{
  // Check the policy variable for this find command type.
  std::string findRootPathVar = "CMAKE_FIND_ROOT_PATH_MODE_";
  findRootPathVar += this->CMakePathName;
  std::string rootPathMode =
    this->Makefile->GetSafeDefinition(findRootPathVar);
  if (rootPathMode == "NEVER") {
    this->FindRootPathMode = RootPathModeNever;
  } else if (rootPathMode == "ONLY") {
    this->FindRootPathMode = RootPathModeOnly;
  } else if (rootPathMode == "BOTH") {
    this->FindRootPathMode = RootPathModeBoth;
  }
}